

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

void Vec_QueGrow(Vec_Que_t *p,int nCapMin)

{
  size_t __size;
  int *piVar1;
  int *piVar2;
  long lVar3;
  
  if (p->nCap < nCapMin) {
    lVar3 = (long)nCapMin;
    __size = lVar3 * 4;
    if (p->pHeap == (int *)0x0) {
      piVar1 = (int *)malloc(__size);
    }
    else {
      piVar1 = (int *)realloc(p->pHeap,__size);
    }
    p->pHeap = piVar1;
    if (p->pOrder == (int *)0x0) {
      piVar2 = (int *)malloc(__size);
    }
    else {
      piVar2 = (int *)realloc(p->pOrder,__size);
      piVar1 = p->pHeap;
    }
    p->pOrder = piVar2;
    memset(piVar1 + p->nCap,0xff,(lVar3 - p->nCap) * 4);
    memset(p->pOrder + p->nCap,0xff,(lVar3 - p->nCap) * 4);
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_QueGrow( Vec_Que_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pHeap  = ABC_REALLOC( int, p->pHeap,  nCapMin );
    p->pOrder = ABC_REALLOC( int, p->pOrder, nCapMin ); 
    memset( p->pHeap  + p->nCap, 0xff, (size_t)(nCapMin - p->nCap) * sizeof(int) );
    memset( p->pOrder + p->nCap, 0xff, (size_t)(nCapMin - p->nCap) * sizeof(int) );
    p->nCap   = nCapMin;
}